

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack4.h
# Opt level: O1

void ncnn::conv3x3s1_winograd63_pack4_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int _elempack;
  int iVar5;
  int iVar6;
  int outch;
  int *piVar7;
  float fVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  int _w;
  int _h;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  Option *opt_00;
  Mat *pMVar19;
  int iVar20;
  Option *opt_01;
  int w_tiles;
  ulong uVar21;
  long lVar22;
  Mat *pMVar23;
  long lVar24;
  long lVar25;
  undefined1 (*pauVar26) [16];
  long lVar27;
  long lVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar34 [16];
  float fVar38;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar58 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  long local_518;
  Mat local_508;
  Option *local_4b8;
  Mat *local_4b0;
  Mat *local_4a8;
  Mat *local_4a0;
  Mat *local_498;
  long local_490;
  Mat local_488;
  Mat local_438;
  undefined1 local_3e8 [64];
  size_t local_3a8;
  float afStack_3a0 [2];
  long local_398;
  long local_390;
  long local_388;
  long local_380;
  long local_378;
  long local_370;
  long local_368;
  long local_360;
  void *local_358;
  long local_350;
  long local_348;
  long local_340;
  float afStack_338 [194];
  
  iVar20 = bottom_blob->c;
  local_4a0 = (Mat *)bottom_blob->elemsize;
  _elempack = bottom_blob->elempack;
  iVar5 = top_blob->w;
  iVar6 = top_blob->h;
  outch = top_blob->c;
  piVar7 = bottom_blob->refcount;
  local_488.data = bottom_blob->data;
  local_488.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_488.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_488.elemsize._0_4_ = SUB84(local_4a0,0);
  local_488.elemsize._4_4_ = (undefined4)((ulong)local_4a0 >> 0x20);
  local_488.allocator = bottom_blob->allocator;
  uVar11 = bottom_blob->dims;
  uVar12 = bottom_blob->w;
  uVar13 = bottom_blob->h;
  uVar14 = bottom_blob->d;
  local_488.cstep = bottom_blob->cstep;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
  }
  iVar5 = (iVar5 + 5) / 6;
  _w = iVar5 * 6;
  iVar6 = (iVar6 + 5) / 6;
  _h = iVar6 * 6;
  local_4b8 = opt;
  local_4b0 = bias;
  local_4a8 = kernel_tm;
  local_498 = top_blob;
  local_488.elempack = _elempack;
  local_488.dims = uVar11;
  local_488.w = uVar12;
  local_488.h = uVar13;
  local_488.d = uVar14;
  local_488.c = iVar20;
  copy_make_border(bottom_blob,&local_488,0,(_h - bottom_blob->h) + 2,0,(_w - bottom_blob->w) + 2,0,
                   0.0,opt);
  pMVar23 = local_4a0;
  local_3a8 = 0;
  local_3e8._0_8_ = (void *)0x0;
  local_3e8._8_4_ = 0;
  local_3e8._12_4_ = 0;
  local_3e8._16_4_ = 0;
  local_3e8._20_8_ = 0;
  local_3e8._32_8_ = (Allocator *)0x0;
  local_3e8._40_4_ = 0;
  local_3e8._44_4_ = 0;
  local_3e8._48_4_ = 0;
  local_3e8._52_4_ = 0;
  local_3e8._56_4_ = 0;
  Mat::create((Mat *)local_3e8,iVar6 * iVar5,0x40,iVar20,(size_t)local_4a0,_elempack,
              opt->workspace_allocator);
  conv3x3s1_winograd63_transform_input_pack4_sse(&local_488,(Mat *)local_3e8,opt_01);
  pMVar19 = local_498;
  opt_00 = local_4b8;
  piVar7 = (int *)CONCAT44(local_488.refcount._4_4_,local_488.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_488.allocator == (Allocator *)0x0) {
        if (local_488.data != (void *)0x0) {
          free(local_488.data);
        }
      }
      else {
        (*(local_488.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_488.cstep = 0;
  local_488.data = (void *)0x0;
  local_488.refcount._0_4_ = 0;
  local_488.refcount._4_4_ = 0;
  local_488.elemsize._0_4_ = 0;
  local_488.elemsize._4_4_ = 0;
  local_488.elempack = 0;
  local_488.h = 0;
  local_488.d = 0;
  local_488.c = 0;
  local_488.allocator = (Allocator *)0x0;
  local_488.dims = 0;
  local_488.w = 0;
  local_438.cstep = 0;
  local_438.data = (void *)0x0;
  local_438.refcount._0_4_ = 0;
  local_438.refcount._4_4_ = 0;
  local_438.elemsize._0_4_ = 0;
  local_438.elemsize._4_4_ = 0;
  local_438.elempack = 0;
  local_438.allocator = (Allocator *)0x0;
  local_438.dims = 0;
  local_438.w = 0;
  local_438.h = 0;
  local_438.d = 0;
  local_438.c = 0;
  convolution_winograd_dot_pack4_sse((Mat *)local_3e8,outch,local_4a8,&local_438,opt_00);
  local_508.cstep = 0;
  local_508.data = (void *)0x0;
  local_508.refcount._0_4_ = 0;
  local_508.refcount._4_4_ = 0;
  local_508.elemsize._0_4_ = 0;
  local_508.elemsize._4_4_ = 0;
  local_508.elempack = 0;
  local_508.allocator = (Allocator *)0x0;
  local_508.dims = 0;
  local_508.w = 0;
  local_508.h = 0;
  local_508.d = 0;
  local_508.c = 0;
  if ((_w == pMVar19->w) && (_h == pMVar19->h)) {
    if (&local_508 != pMVar19) {
      piVar7 = pMVar19->refcount;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + 1;
        UNLOCK();
      }
      local_508.data = pMVar19->data;
      local_508.refcount._0_4_ = SUB84(pMVar19->refcount,0);
      local_508.refcount._4_4_ = (undefined4)((ulong)pMVar19->refcount >> 0x20);
      local_508.elemsize._0_4_ = (undefined4)pMVar19->elemsize;
      local_508.elemsize._4_4_ = (undefined4)(pMVar19->elemsize >> 0x20);
      local_508.elempack = pMVar19->elempack;
      local_508.allocator = pMVar19->allocator;
      uVar15 = pMVar19->dims;
      uVar16 = pMVar19->w;
      uVar17 = pMVar19->h;
      uVar18 = pMVar19->d;
      local_508.c = pMVar19->c;
      local_508.cstep = pMVar19->cstep;
      local_508.dims = uVar15;
      local_508.w = uVar16;
      local_508.h = uVar17;
      local_508.d = uVar18;
    }
  }
  else {
    Mat::create(&local_508,_w,_h,outch,(size_t)pMVar23,_elempack,opt_00->workspace_allocator);
  }
  local_350 = (long)local_508.c;
  if (0 < local_350) {
    local_358 = local_4b0->data;
    local_360 = (long)local_508.h;
    local_4b0 = (Mat *)(ulong)(uint)(local_508.h / 6);
    local_340 = (long)local_508.w;
    uVar10 = local_508.w / 6;
    iVar20 = uVar10 * (local_508.h / 6);
    local_348 = (ulong)uVar10 * 0x10;
    local_368 = (long)(iVar20 * 4) * 4;
    local_370 = (long)(iVar20 * 8) * 4;
    local_378 = (long)(iVar20 * 0xc) * 4;
    local_380 = (long)(iVar20 * 0x10) * 4;
    local_388 = (long)(iVar20 * 0x14) * 4;
    local_390 = (long)(iVar20 * 0x18) * 4;
    local_398 = (long)(iVar20 * 0x1c) * 4;
    lVar27 = 0;
    do {
      local_490 = lVar27;
      if (local_358 == (void *)0x0) {
        fVar29 = 0.0;
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
      }
      else {
        pfVar1 = (float *)((long)local_358 + local_490 * 0x10);
        fVar29 = *pfVar1;
        fVar30 = pfVar1[1];
        fVar31 = pfVar1[2];
        fVar32 = pfVar1[3];
      }
      if (5 < local_508.h) {
        lVar28 = CONCAT44(local_438.elemsize._4_4_,(undefined4)local_438.elemsize) * local_438.cstep
                 * local_490;
        lVar27 = (long)local_508.data +
                 local_508.cstep * CONCAT44(local_508.elemsize._4_4_,(undefined4)local_508.elemsize)
                 * local_490 + 0x50;
        local_4a8 = (Mat *)((long)local_508.w *
                            CONCAT44(local_508.elemsize._4_4_,(undefined4)local_508.elemsize) * 6);
        local_518 = 0;
        pMVar23 = (Mat *)0x0;
        do {
          local_4a0 = pMVar23;
          if (5 < local_508.w) {
            uVar21 = 0;
            lVar22 = local_518;
            do {
              lVar24 = -0x80;
              lVar25 = lVar22;
              do {
                auVar34 = *(undefined1 (*) [16])((long)local_438.data + lVar25 + local_368 + lVar28)
                ;
                auVar39 = *(undefined1 (*) [16])((long)local_438.data + lVar25 + local_370 + lVar28)
                ;
                auVar43 = *(undefined1 (*) [16])((long)local_438.data + lVar25 + local_378 + lVar28)
                ;
                auVar3 = *(undefined1 (*) [16])((long)local_438.data + lVar25 + local_380 + lVar28);
                auVar58 = *(undefined1 (*) [16])((long)local_438.data + lVar25 + local_388 + lVar28)
                ;
                auVar4 = *(undefined1 (*) [16])((long)local_438.data + lVar25 + local_390 + lVar28);
                fVar59 = auVar39._0_4_ + auVar34._0_4_;
                fVar60 = auVar39._4_4_ + auVar34._4_4_;
                fVar61 = auVar39._8_4_ + auVar34._8_4_;
                fVar62 = auVar39._12_4_ + auVar34._12_4_;
                auVar34 = vsubps_avx(auVar34,auVar39);
                fVar38 = auVar3._0_4_ + auVar43._0_4_;
                fVar40 = auVar3._4_4_ + auVar43._4_4_;
                fVar41 = auVar3._8_4_ + auVar43._8_4_;
                fVar42 = auVar3._12_4_ + auVar43._12_4_;
                auVar39 = vsubps_avx(auVar43,auVar3);
                fVar44 = auVar4._0_4_ + auVar58._0_4_;
                fVar47 = auVar4._4_4_ + auVar58._4_4_;
                fVar50 = auVar4._8_4_ + auVar58._8_4_;
                fVar51 = auVar4._12_4_ + auVar58._12_4_;
                auVar43 = vsubps_avx(auVar58,auVar4);
                pfVar1 = (float *)((long)local_438.data + lVar25 + lVar28);
                fVar52 = pfVar1[1];
                fVar54 = pfVar1[2];
                fVar56 = pfVar1[3];
                fVar45 = auVar39._0_4_;
                fVar46 = auVar39._4_4_;
                fVar48 = auVar39._8_4_;
                fVar49 = auVar39._12_4_;
                fVar53 = auVar34._0_4_;
                fVar55 = auVar34._4_4_;
                fVar57 = auVar34._8_4_;
                fVar8 = auVar34._12_4_;
                pfVar2 = (float *)((long)local_438.data + lVar25 + local_398 + lVar28);
                fVar33 = *pfVar2;
                fVar35 = pfVar2[1];
                fVar36 = pfVar2[2];
                fVar37 = pfVar2[3];
                *(float *)((long)afStack_338 + lVar24 + 0x80) =
                     fVar59 + *pfVar1 + fVar44 * 32.0 + fVar38;
                *(float *)((long)afStack_338 + lVar24 + 0x84) =
                     fVar60 + fVar52 + fVar47 * 32.0 + fVar40;
                *(float *)((long)afStack_338 + lVar24 + 0x88) =
                     fVar61 + fVar54 + fVar50 * 32.0 + fVar41;
                *(float *)((long)afStack_338 + lVar24 + 0x8c) =
                     fVar62 + fVar56 + fVar51 * 32.0 + fVar42;
                *(float *)((long)afStack_338 + lVar24 + 0x180) =
                     fVar38 * 4.0 + fVar59 + fVar44 * 8.0;
                *(float *)((long)afStack_338 + lVar24 + 0x184) =
                     fVar40 * 4.0 + fVar60 + fVar47 * 8.0;
                *(float *)((long)afStack_338 + lVar24 + 0x188) =
                     fVar41 * 4.0 + fVar61 + fVar50 * 8.0;
                *(float *)((long)afStack_338 + lVar24 + 0x18c) =
                     fVar42 * 4.0 + fVar62 + fVar51 * 8.0;
                *(float *)((long)afStack_338 + lVar24 + 0x280) =
                     fVar59 + fVar44 + fVar44 + fVar38 * 16.0;
                *(float *)((long)afStack_338 + lVar24 + 0x284) =
                     fVar60 + fVar47 + fVar47 + fVar40 * 16.0;
                *(float *)((long)afStack_338 + lVar24 + 0x288) =
                     fVar61 + fVar50 + fVar50 + fVar41 * 16.0;
                *(float *)((long)afStack_338 + lVar24 + 0x28c) =
                     fVar62 + fVar51 + fVar51 + fVar42 * 16.0;
                fVar52 = auVar43._0_4_;
                fVar54 = auVar43._4_4_;
                fVar56 = auVar43._8_4_;
                fVar38 = auVar43._12_4_;
                *(float *)((long)afStack_338 + lVar24 + 0x100) =
                     fVar52 * 16.0 + fVar45 + fVar45 + fVar53;
                *(float *)((long)afStack_338 + lVar24 + 0x104) =
                     fVar54 * 16.0 + fVar46 + fVar46 + fVar55;
                *(float *)((long)afStack_338 + lVar24 + 0x108) =
                     fVar56 * 16.0 + fVar48 + fVar48 + fVar57;
                *(float *)((long)afStack_338 + lVar24 + 0x10c) =
                     fVar38 * 16.0 + fVar49 + fVar49 + fVar8;
                *(float *)((long)afStack_338 + lVar24 + 0x200) =
                     fVar45 * 8.0 + fVar53 + fVar52 * 4.0;
                *(float *)((long)afStack_338 + lVar24 + 0x204) =
                     fVar46 * 8.0 + fVar55 + fVar54 * 4.0;
                *(float *)((long)afStack_338 + lVar24 + 0x208) =
                     fVar48 * 8.0 + fVar57 + fVar56 * 4.0;
                *(float *)((long)afStack_338 + lVar24 + 0x20c) = fVar49 * 8.0 + fVar8 + fVar38 * 4.0
                ;
                *(float *)((long)afStack_338 + lVar24 + 0x300) =
                     fVar45 * 32.0 + fVar53 + fVar33 + fVar52;
                *(float *)((long)afStack_338 + lVar24 + 0x304) =
                     fVar46 * 32.0 + fVar55 + fVar35 + fVar54;
                *(float *)(&stack0xffffffffffffffd0 + lVar24) =
                     fVar48 * 32.0 + fVar57 + fVar36 + fVar56;
                *(float *)(&stack0xffffffffffffffd4 + lVar24) =
                     fVar49 * 32.0 + fVar8 + fVar37 + fVar38;
                lVar25 = lVar25 + (long)(iVar20 * 0x20) * 4;
                lVar24 = lVar24 + 0x10;
              } while (lVar24 != 0);
              pauVar26 = (undefined1 (*) [16])(((long)((uVar21 << 0x23) * 3) >> 0x1e) + lVar27);
              lVar25 = 0x70;
              do {
                auVar34 = *(undefined1 (*) [16])((long)&local_398 + lVar25);
                auVar39 = *(undefined1 (*) [16])((long)&local_388 + lVar25);
                auVar43 = *(undefined1 (*) [16])((long)&local_378 + lVar25);
                auVar3 = *(undefined1 (*) [16])((long)&local_368 + lVar25);
                auVar58 = *(undefined1 (*) [16])((long)&local_358 + lVar25);
                auVar4 = *(undefined1 (*) [16])((long)&local_348 + lVar25);
                auVar9 = vsubps_avx(auVar34,auVar39);
                fVar59 = auVar3._0_4_ + auVar43._0_4_;
                fVar60 = auVar3._4_4_ + auVar43._4_4_;
                fVar61 = auVar3._8_4_ + auVar43._8_4_;
                fVar62 = auVar3._12_4_ + auVar43._12_4_;
                auVar43 = vsubps_avx(auVar43,auVar3);
                fVar45 = auVar4._0_4_ + auVar58._0_4_;
                fVar48 = auVar4._4_4_ + auVar58._4_4_;
                fVar44 = auVar4._8_4_ + auVar58._8_4_;
                fVar50 = auVar4._12_4_ + auVar58._12_4_;
                auVar3 = vsubps_avx(auVar58,auVar4);
                fVar33 = auVar34._0_4_ + fVar29 + auVar39._0_4_;
                fVar35 = auVar34._4_4_ + fVar30 + auVar39._4_4_;
                fVar36 = auVar34._8_4_ + fVar31 + auVar39._8_4_;
                fVar37 = auVar34._12_4_ + fVar32 + auVar39._12_4_;
                fVar53 = *(float *)((long)afStack_3a0 + lVar25 + -4);
                fVar55 = *(float *)((long)afStack_3a0 + lVar25);
                fVar57 = *(float *)((long)afStack_3a0 + lVar25 + 4);
                auVar58._0_4_ = fVar59 * 4.0 + fVar33 + fVar45 * 8.0;
                auVar58._4_4_ = fVar60 * 4.0 + fVar35 + fVar48 * 8.0;
                auVar58._8_4_ = fVar61 * 4.0 + fVar36 + fVar44 * 8.0;
                auVar58._12_4_ = fVar62 * 4.0 + fVar37 + fVar50 * 8.0;
                fVar46 = auVar9._0_4_ + fVar29;
                fVar49 = auVar9._4_4_ + fVar30;
                fVar47 = auVar9._8_4_ + fVar31;
                fVar51 = auVar9._12_4_ + fVar32;
                fVar38 = auVar43._0_4_;
                fVar40 = auVar43._4_4_;
                fVar41 = auVar43._8_4_;
                fVar42 = auVar43._12_4_;
                fVar8 = *(float *)((long)afStack_338 + lVar25);
                fVar52 = *(float *)((long)afStack_338 + lVar25 + 4);
                fVar54 = *(float *)((long)afStack_338 + lVar25 + 8);
                fVar56 = *(float *)((long)afStack_338 + lVar25 + 0xc);
                *(float *)pauVar26[-5] =
                     fVar59 + fVar45 * 32.0 + fVar33 + *(float *)((long)afStack_3a0 + lVar25 + -8);
                *(float *)(pauVar26[-5] + 4) = fVar60 + fVar48 * 32.0 + fVar35 + fVar53;
                *(float *)(pauVar26[-5] + 8) = fVar61 + fVar44 * 32.0 + fVar36 + fVar55;
                *(float *)(pauVar26[-5] + 0xc) = fVar62 + fVar50 * 32.0 + fVar37 + fVar57;
                pauVar26[-3] = auVar58;
                *(float *)pauVar26[-1] = fVar59 * 16.0 + fVar45 + fVar45 + fVar33;
                *(float *)(pauVar26[-1] + 4) = fVar60 * 16.0 + fVar48 + fVar48 + fVar35;
                *(float *)(pauVar26[-1] + 8) = fVar61 * 16.0 + fVar44 + fVar44 + fVar36;
                *(float *)(pauVar26[-1] + 0xc) = fVar62 * 16.0 + fVar50 + fVar50 + fVar37;
                fVar53 = auVar3._0_4_;
                fVar55 = auVar3._4_4_;
                fVar57 = auVar3._8_4_;
                fVar33 = auVar3._12_4_;
                auVar34._0_4_ = fVar46 + fVar38 + fVar38 + fVar53 * 16.0;
                auVar34._4_4_ = fVar49 + fVar40 + fVar40 + fVar55 * 16.0;
                auVar34._8_4_ = fVar47 + fVar41 + fVar41 + fVar57 * 16.0;
                auVar34._12_4_ = fVar51 + fVar42 + fVar42 + fVar33 * 16.0;
                auVar39._0_4_ = fVar46 + fVar38 * 8.0 + fVar53 * 4.0;
                auVar39._4_4_ = fVar49 + fVar40 * 8.0 + fVar55 * 4.0;
                auVar39._8_4_ = fVar47 + fVar41 * 8.0 + fVar57 * 4.0;
                auVar39._12_4_ = fVar51 + fVar42 * 8.0 + fVar33 * 4.0;
                auVar43._0_4_ = fVar38 * 32.0 + fVar46 + fVar8 + fVar53;
                auVar43._4_4_ = fVar40 * 32.0 + fVar49 + fVar52 + fVar55;
                auVar43._8_4_ = fVar41 * 32.0 + fVar47 + fVar54 + fVar57;
                auVar43._12_4_ = fVar42 * 32.0 + fVar51 + fVar56 + fVar33;
                pauVar26[-4] = auVar34;
                pauVar26[-2] = auVar39;
                *pauVar26 = auVar43;
                lVar25 = lVar25 + 0x80;
                pauVar26 = (undefined1 (*) [16])(*pauVar26 + (long)(local_508.w * 4) * 4);
              } while (lVar25 != 0x370);
              uVar21 = uVar21 + 1;
              lVar22 = lVar22 + 0x10;
            } while (uVar21 != uVar10);
          }
          pMVar23 = (Mat *)((long)&local_4a0->data + 1);
          local_518 = local_518 + local_348;
          lVar27 = (long)&local_4a8->data + lVar27;
        } while (pMVar23 != local_4b0);
      }
      lVar27 = local_490 + 1;
    } while (local_490 + 1 != local_350);
  }
  copy_cut_border(&local_508,local_498,0,local_508.h - local_498->h,0,local_508.w - local_498->w,
                  local_4b8);
  piVar7 = (int *)CONCAT44(local_508.refcount._4_4_,local_508.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_508.allocator == (Allocator *)0x0) {
        if (local_508.data != (void *)0x0) {
          free(local_508.data);
        }
      }
      else {
        (*(local_508.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_508.cstep = 0;
  local_508.data = (void *)0x0;
  local_508.refcount._0_4_ = 0;
  local_508.refcount._4_4_ = 0;
  local_508.elemsize._0_4_ = 0;
  local_508.elemsize._4_4_ = 0;
  local_508.elempack = 0;
  local_508.dims = 0;
  local_508.w = 0;
  local_508.h = 0;
  local_508.d = 0;
  local_508.c = 0;
  piVar7 = (int *)CONCAT44(local_438.refcount._4_4_,local_438.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_438.allocator == (Allocator *)0x0) {
        if (local_438.data != (void *)0x0) {
          free(local_438.data);
        }
      }
      else {
        (*(local_438.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_438.cstep = 0;
  local_438.data = (void *)0x0;
  local_438.refcount._0_4_ = 0;
  local_438.refcount._4_4_ = 0;
  local_438.elemsize._0_4_ = 0;
  local_438.elemsize._4_4_ = 0;
  local_438.elempack = 0;
  local_438.dims = 0;
  local_438.w = 0;
  local_438.h = 0;
  local_438.d = 0;
  local_438.c = 0;
  piVar7 = (int *)CONCAT44(local_3e8._12_4_,local_3e8._8_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if ((Allocator *)local_3e8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_3e8._0_8_ != (void *)0x0) {
          free((void *)local_3e8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_3e8._32_8_)[3])();
      }
    }
  }
  local_3a8 = 0;
  local_3e8._0_8_ = (void *)0x0;
  local_3e8._8_4_ = 0;
  local_3e8._12_4_ = 0;
  local_3e8._16_4_ = 0;
  local_3e8._20_8_ = 0;
  local_3e8._40_4_ = 0;
  local_3e8._44_4_ = 0;
  local_3e8._48_4_ = 0;
  local_3e8._52_4_ = 0;
  local_3e8._56_4_ = 0;
  piVar7 = (int *)CONCAT44(local_488.refcount._4_4_,local_488.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_488.allocator == (Allocator *)0x0) {
        if (local_488.data != (void *)0x0) {
          free(local_488.data);
        }
      }
      else {
        (*(local_488.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 6n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 5) / 6 * 6;
    outh = (outh + 5) / 6 * 6;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 6;
        int h_tiles = outh / 6;
        int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 64, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd63_transform_input_pack4_sse(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack4_sse(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd63_transform_output_pack4_sse(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}